

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformField.cpp
# Opt level: O2

void __thiscall OpenMD::UniformField::initialize(UniformField *this)

{
  Globals *pGVar1;
  vector<double,_std::allocator<double>_> ef;
  _Vector_base<double,_std::allocator<double>_> local_48;
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pGVar1 = this->simParams;
  if ((pGVar1->ElectricField).super_ParameterBase.empty_ == false) {
    this->doUniformField = true;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_28,&(pGVar1->ElectricField).data_);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)&local_48,&local_28);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
    pGVar1 = this->simParams;
  }
  if ((pGVar1->UniformField).super_ParameterBase.empty_ == false) {
    this->doUniformField = true;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_28,&(pGVar1->UniformField).data_);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)&local_48,&local_28);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  }
  if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start != 0x18) {
    snprintf(painCave.errMsg,2000,
             "UniformField: Incorrect number of parameters specified.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,(long)local_48._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3);
    painCave.isFatal = 1;
    simError();
  }
  (this->EF).super_Vector<double,_3U>.data_[0] = *local_48._M_impl.super__Vector_impl_data._M_start;
  (this->EF).super_Vector<double,_3U>.data_[1] =
       local_48._M_impl.super__Vector_impl_data._M_start[1];
  (this->EF).super_Vector<double,_3U>.data_[2] =
       local_48._M_impl.super__Vector_impl_data._M_start[2];
  if ((((this->super_ForceModifier).info_)->sman_->atomStorageLayout_ & 0x40) != 0) {
    this->doParticlePot = true;
  }
  this->initialized = true;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void UniformField::initialize() {
    std::vector<RealType> ef;

    if (simParams->haveElectricField()) {
      doUniformField = true;
      ef             = simParams->getElectricField();
    }
    if (simParams->haveUniformField()) {
      doUniformField = true;
      ef             = simParams->getUniformField();
    }
    if (ef.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UniformField: Incorrect number of parameters specified.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               ef.size());
      painCave.isFatal = 1;
      simError();
    }
    EF.x() = ef[0];
    EF.y() = ef[1];
    EF.z() = ef[2];

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;
    initialized = true;
  }